

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csat_apis.c
# Opt level: O2

void ABC_TargetResFree(CSAT_Target_ResultT *p)

{
  char **__ptr;
  int i;
  long lVar1;
  
  if (p != (CSAT_Target_ResultT *)0x0) {
    if (p->names != (char **)0x0) {
      for (lVar1 = 0; __ptr = p->names, lVar1 < p->no_sig; lVar1 = lVar1 + 1) {
        if (__ptr[lVar1] != (char *)0x0) {
          free(__ptr[lVar1]);
          p->names[lVar1] = (char *)0x0;
        }
      }
      if (__ptr != (char **)0x0) {
        free(__ptr);
        p->names = (char **)0x0;
      }
    }
    free(p->values);
    free(p);
    return;
  }
  return;
}

Assistant:

void ABC_TargetResFree( CSAT_Target_ResultT * p )
{
    if ( p == NULL )
        return;
    if( p->names )
    {
        int i = 0;
        for ( i = 0; i < p->no_sig; i++ )
        {
            ABC_FREE(p->names[i]);
        }
    }
    ABC_FREE( p->names );
    ABC_FREE( p->values );
    ABC_FREE( p );
}